

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomTime::write(DomTime *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QString local_40;
  long local_28;
  
  aVar1._4_4_ = in_register_00000034;
  aVar1._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"time";
    local_40.d.size = 4;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar2.m_size = (size_t)local_40.d.ptr;
  QVar2.field_0.m_data = aVar1.m_data;
  QXmlStreamWriter::writeStartElement(QVar2);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((this->m_children & 1) != 0) {
    QString::number((int)&local_40,this->m_hour);
    QVar3.m_size = (size_t)L"hour";
    QVar3.field_0.m_data = aVar1.m_data;
    QVar6.m_size = (size_t)local_40.d.ptr;
    QVar6.field_0.m_data = (void *)0x8000000000000004;
    QXmlStreamWriter::writeTextElement(QVar3,QVar6);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 2) != 0) {
    QString::number((int)&local_40,this->m_minute);
    QVar4.m_size = (size_t)L"minute";
    QVar4.field_0.m_data = aVar1.m_data;
    QVar7.m_size = (size_t)local_40.d.ptr;
    QVar7.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeTextElement(QVar4,QVar7);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 4) != 0) {
    QString::number((int)&local_40,this->m_second);
    QVar5.m_size = (size_t)L"second";
    QVar5.field_0.m_data = aVar1.m_data;
    QVar8.m_size = (size_t)local_40.d.ptr;
    QVar8.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeTextElement(QVar5,QVar8);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomTime::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("time") : tagName.toLower());

    if (m_children & Hour)
        writer.writeTextElement(u"hour"_s, QString::number(m_hour));

    if (m_children & Minute)
        writer.writeTextElement(u"minute"_s, QString::number(m_minute));

    if (m_children & Second)
        writer.writeTextElement(u"second"_s, QString::number(m_second));

    writer.writeEndElement();
}